

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

QString * __thiscall QMakeEvaluator::filePathArg0(QMakeEvaluator *this,ProStringList *args)

{
  QMakeEvaluator *in_RDX;
  QList<ProString> *in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  QString *fn;
  ProStringRoUser u1;
  ProString *ps;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar1;
  ProStringRoUser local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.m_rs = (QString *)0xaaaaaaaaaaaaaaaa;
  ps = in_RDI;
  QList<ProString>::at(in_RSI,(qsizetype)in_RDI);
  ProStringRoUser::ProStringRoUser((ProStringRoUser *)in_RSI,ps,(QString *)0x2c83ae);
  uVar1 = 0;
  (in_RDI->m_string).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->m_string).d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->m_string).d.size = -0x5555555555555556;
  ProStringRoUser::str(&local_10);
  resolvePath(in_RDX,(QString *)CONCAT17(uVar1,in_stack_ffffffffffffffd0));
  QString::detach((QString *)in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return &ps->m_string;
}

Assistant:

QString QMakeEvaluator::filePathArg0(const ProStringList &args)
{
    ProStringRoUser u1(args.at(0), m_tmp1);
    QString fn = resolvePath(u1.str());
    fn.detach();
    return fn;
}